

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O2

HRESULT __thiscall Js::SimpleDataCacheWrapper::WriteHeader(SimpleDataCacheWrapper *this)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  DWORD local_20;
  DWORD local_1c;
  DWORD jscriptMajorVersion;
  DWORD jscriptMinorVersion;
  
  HVar3 = AutoSystemInfo::GetJscriptFileVersion(&local_20,&local_1c,(DWORD *)0x0,(DWORD *)0x0);
  if (-1 < HVar3) {
    if (this->bytesWrittenInBlock != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimpleDataCacheWrapper.cpp"
                                  ,0x74,"(this->bytesWrittenInBlock == 0)",
                                  "this->bytesWrittenInBlock == 0");
      if (!bVar2) goto LAB_009e6aac;
      *puVar4 = 0;
    }
    HVar3 = EnsureWriteStream(this);
    if (((-1 < HVar3) && (HVar3 = EnsureWriteStream(this), -1 < HVar3)) &&
       (this->bytesWrittenInBlock != 8)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimpleDataCacheWrapper.cpp"
                                  ,0x79,"(this->bytesWrittenInBlock == sizeof(DWORD) * 2)",
                                  "this->bytesWrittenInBlock == sizeof(DWORD) * 2");
      if (!bVar2) {
LAB_009e6aac:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return HVar3;
}

Assistant:

HRESULT SimpleDataCacheWrapper::WriteHeader()
    {
        DWORD jscriptMajorVersion;
        DWORD jscriptMinorVersion;
        HRESULT hr = E_FAIL;

        IFFAILRET(AutoSystemInfo::GetJscriptFileVersion(&jscriptMajorVersion, &jscriptMinorVersion));

        Assert(this->bytesWrittenInBlock == 0);

        IFFAILRET(Write(jscriptMajorVersion));
        IFFAILRET(Write(jscriptMinorVersion));

        Assert(this->bytesWrittenInBlock == sizeof(DWORD) * 2);

        return hr;
    }